

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::GetTransitionType
          (TimeZoneInfo *this,int_fast32_t utc_offset,bool is_dst,string *abbr,uint_least8_t *index)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  TransitionType *pTVar5;
  size_type in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  *this_00;
  char __c;
  TransitionType *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<absl::time_internal::cctz::TransitionType_*,_std::vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>_>
  local_78;
  const_iterator local_70;
  __normal_iterator<absl::time_internal::cctz::TransitionType_*,_std::vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>_>
  local_68;
  reference local_60;
  TransitionType *tt_1;
  char *tt_abbr;
  TransitionType *tt;
  size_t abbr_index;
  size_t type_index;
  uint_least8_t *index_local;
  string *abbr_local;
  int_fast32_t iStack_20;
  bool is_dst_local;
  int_fast32_t utc_offset_local;
  TimeZoneInfo *this_local;
  
  abbr_index = 0;
  type_index = (size_t)index;
  index_local = (uint_least8_t *)abbr;
  abbr_local._7_1_ = is_dst;
  iStack_20 = utc_offset;
  utc_offset_local = (int_fast32_t)this;
  tt = (TransitionType *)
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                 (&this->abbreviations_);
  for (; sVar1 = abbr_index,
      sVar3 = std::
              vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
              ::size(&this->transition_types_), sVar1 != sVar3; abbr_index = abbr_index + 1) {
    tt_abbr = (char *)std::
                      vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                      ::operator[](&this->transition_types_,abbr_index);
    tt_1 = (TransitionType *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    bVar2 = std::operator==((char *)tt_1,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            index_local);
    if (bVar2) {
      tt = (TransitionType *)(ulong)(byte)tt_abbr[0x29];
    }
    if (((*(int *)tt_abbr == iStack_20) && ((tt_abbr[0x28] & 1U) == (abbr_local._7_1_ & 1))) &&
       (tt == (TransitionType *)(ulong)(byte)tt_abbr[0x29])) break;
  }
  if ((abbr_index < 0x100) && (tt < (TransitionType *)0x100)) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)abbr_index;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
             ::size(&this->transition_types_);
    if (this_01 == pbVar4) {
      this_00 = &this->transition_types_;
      local_78._M_current =
           (TransitionType *)
           std::
           vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
           ::end(&this->transition_types_);
      __gnu_cxx::
      __normal_iterator<absl::time_internal::cctz::TransitionType_const*,std::vector<absl::time_internal::cctz::TransitionType,std::allocator<absl::time_internal::cctz::TransitionType>>>
      ::__normal_iterator<absl::time_internal::cctz::TransitionType*>
                ((__normal_iterator<absl::time_internal::cctz::TransitionType_const*,std::vector<absl::time_internal::cctz::TransitionType,std::allocator<absl::time_internal::cctz::TransitionType>>>
                  *)&local_70,&local_78);
      local_68._M_current =
           (TransitionType *)
           std::
           vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
           ::emplace<>(this_00,local_70);
      __c = (char)((ulong)this_00 >> 0x38);
      local_60 = __gnu_cxx::
                 __normal_iterator<absl::time_internal::cctz::TransitionType_*,_std::vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>_>
                 ::operator*(&local_68);
      local_60->utc_offset = (int_least32_t)iStack_20;
      local_60->is_dst = (bool)(abbr_local._7_1_ & 1);
      __str = tt;
      pTVar5 = (TransitionType *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (&this->abbreviations_);
      if (__str == pTVar5) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __str);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_01,(size_type)__str,__c);
      }
      local_60->abbr_index = (uint_least8_t)tt;
    }
    *(char *)type_index = (char)abbr_index;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::GetTransitionType(std::int_fast32_t utc_offset, bool is_dst,
                                     const std::string& abbr,
                                     std::uint_least8_t* index) {
  std::size_t type_index = 0;
  std::size_t abbr_index = abbreviations_.size();
  for (; type_index != transition_types_.size(); ++type_index) {
    const TransitionType& tt(transition_types_[type_index]);
    const char* tt_abbr = &abbreviations_[tt.abbr_index];
    if (tt_abbr == abbr) abbr_index = tt.abbr_index;
    if (tt.utc_offset == utc_offset && tt.is_dst == is_dst) {
      if (abbr_index == tt.abbr_index) break;  // reuse
    }
  }
  if (type_index > 255 || abbr_index > 255) {
    // No index space (8 bits) available for a new type or abbreviation.
    return false;
  }
  if (type_index == transition_types_.size()) {
    TransitionType& tt(*transition_types_.emplace(transition_types_.end()));
    tt.utc_offset = static_cast<std::int_least32_t>(utc_offset);
    tt.is_dst = is_dst;
    if (abbr_index == abbreviations_.size()) {
      abbreviations_.append(abbr);
      abbreviations_.append(1, '\0');
    }
    tt.abbr_index = static_cast<std::uint_least8_t>(abbr_index);
  }
  *index = static_cast<std::uint_least8_t>(type_index);
  return true;
}